

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_val_get_format(uint32_t options,LY_VALUE_FORMAT *format)

{
  char *pcVar1;
  
  if (format == (LY_VALUE_FORMAT *)0x0) {
    pcVar1 = "format";
  }
  else {
    if ((~options & 0xc) != 0) {
      if ((options & 4) == 0) {
        if ((options & 8) == 0) {
          *format = LY_VALUE_JSON;
        }
        else {
          *format = LY_VALUE_CANON;
        }
      }
      else {
        *format = LY_VALUE_LYB;
      }
      return LY_SUCCESS;
    }
    pcVar1 = "!((options & 0x04) && (options & 0x08))";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar1,
         "lyd_new_val_get_format");
  return LY_EVALID;
}

Assistant:

static LY_ERR
lyd_new_val_get_format(uint32_t options, LY_VALUE_FORMAT *format)
{
    LY_CHECK_ARG_RET(NULL, format, !((options & LYD_NEW_VAL_BIN) && (options & LYD_NEW_VAL_CANON)), LY_EVALID);

    if (options & LYD_NEW_VAL_BIN) {
        *format = LY_VALUE_LYB;
    } else if (options & LYD_NEW_VAL_CANON) {
        *format = LY_VALUE_CANON;
    } else {
        *format = LY_VALUE_JSON;
    }

    return LY_SUCCESS;
}